

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Signal_PDU::Signal_PDU(Signal_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Signal_PDU *this_local;
  
  Radio_Communications_Header::Radio_Communications_Header(&this->super_Radio_Communications_Header)
  ;
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Signal_PDU_0032ea98;
  DATA_TYPE::EncodingScheme::EncodingScheme(&this->m_EncodingScheme);
  std::vector<char,_std::allocator<char>_>::vector(&this->m_vData);
  (*(this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6[3])
            (this,stream,0);
  return;
}

Assistant:

Signal_PDU::Signal_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}